

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O0

uint64_t __thiscall
BamTools::Internal::BamStandardIndex::LookupLinearOffset
          (BamStandardIndex *this,BaiReferenceSummary *refSummary,int *index)

{
  uint64_t linearOffset;
  int64_t linearOffsetFilePosition;
  int in_stack_00000044;
  uint64_t *in_stack_00000048;
  BamStandardIndex *in_stack_00000050;
  undefined8 local_28;
  
  Seek(in_stack_00000050,(int64_t *)in_stack_00000048,in_stack_00000044);
  ReadLinearOffset(in_stack_00000050,in_stack_00000048);
  return local_28;
}

Assistant:

uint64_t BamStandardIndex::LookupLinearOffset(const BaiReferenceSummary& refSummary,
                                              const int& index)
{

    // attempt seek to proper index file position
    const int64_t linearOffsetFilePosition = (int64_t)refSummary.FirstLinearOffsetFilePosition +
                                             index * BamStandardIndex::SIZEOF_LINEAROFFSET;
    Seek(linearOffsetFilePosition, SEEK_SET);

    // read linear offset from BAI file
    uint64_t linearOffset;
    ReadLinearOffset(linearOffset);
    return linearOffset;
}